

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O0

void __thiscall MinVR::VRDataIndex::pushState(VRDataIndex *this)

{
  bool bVar1;
  iterator this_00;
  pointer ppVar2;
  VRDatum *pVVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
  *in_RDI;
  iterator it;
  _Self in_stack_ffffffffffffffe0;
  int iVar4;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
       ::begin(in_RDI);
  while( true ) {
    iVar4 = (int)((ulong)in_stack_ffffffffffffffe0._M_node >> 0x20);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
              ::end(in_RDI);
    bVar1 = std::operator!=(local_10,(_Self *)&stack0xffffffffffffffe8);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
                           *)0x143fd9);
    pVVar3 = VRDatumPtr::operator->(&ppVar2->second);
    (*pVVar3->_vptr_VRDatum[4])();
    in_stack_ffffffffffffffe0 =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
         ::operator++(this_00._M_node,iVar4);
  }
  return;
}

Assistant:

void VRDataIndex::pushState() {

  for (std::map<std::string, VRDatumPtr>::iterator it = _theIndex.begin();
       it != _theIndex.end(); it++) {
    it->second->push();
  }
}